

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_untransformed_argb(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_48_8_668f4b82 local_118;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      blend_untransformed_generic(count,spans,userData);
      return;
    }
    goto LAB_005aa165;
  }
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,spans,count);
  local_118.yoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x78));
  local_118.xoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x70));
  local_118.image_width = (int)*(undefined8 *)((long)userData + 0xb0);
  local_118.image_height = (int)((ulong)*(undefined8 *)((long)userData + 0xb0) >> 0x20);
  local_118._36_4_ = 0xaaaaaaaa;
  local_118.const_alpha = *(int *)((long)userData + 0xe8);
  uVar7 = (long)(count + 0x20) / 0x40 & 0xffffffff;
  local_118.op = &op;
  local_118.spans = spans;
  local_118.data = (QSpanData *)userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((count < 0x60) || (pQVar3 == (QThreadPool *)0x0)) ||
     ((int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp < 3)) {
LAB_005aa048:
    blend_untransformed_argb::anon_class_48_8_668f4b82::operator()(&local_118,0,count);
  }
  else {
    QThread::currentThread();
    cVar2 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar2 != '\0') goto LAB_005aa048;
    _semaphore = &DAT_aaaaaaaaaaaaaaaa;
    iVar6 = 0;
    QSemaphore::QSemaphore(&semaphore,0);
    while( true ) {
      iVar8 = (int)uVar7;
      uVar7 = (ulong)(iVar8 - 1);
      if (iVar8 == 0) break;
      iVar8 = (count - iVar6) / iVar8;
      puVar4 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar4 + 1) = 1;
      *puVar4 = QFactoryLoader::keyMap;
      puVar5 = (undefined8 *)operator_new(0x20);
      *puVar5 = QRunnable::QGenericRunnable::
                Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4572:5)>
                ::impl;
      *(int *)(puVar5 + 1) = iVar6;
      *(int *)((long)puVar5 + 0xc) = iVar8;
      puVar5[2] = &local_118;
      puVar5[3] = &semaphore;
      puVar4[2] = puVar5;
      QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
      iVar6 = iVar6 + iVar8;
    }
    QSemaphore::acquire((int)&semaphore);
    QSemaphore::~QSemaphore(&semaphore);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005aa165:
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);

    auto function = [=, &op] (int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                    uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                    op.func(dest, src, length, coverage);
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}